

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

nn_optset * nn_sock_optset(nn_sock *self,int id)

{
  uint uVar1;
  nn_transport *pnVar2;
  nn_optset *pnVar3;
  int in_ESI;
  long in_RDI;
  nn_transport *tp;
  int index;
  nn_optset *local_8;
  
  uVar1 = 0xffffffff - in_ESI;
  if (uVar1 < 4) {
    if (*(long *)(in_RDI + 0x170 + (long)(int)uVar1 * 8) == 0) {
      pnVar2 = nn_global_transport(in_ESI);
      if (pnVar2 == (nn_transport *)0x0) {
        local_8 = (nn_optset *)0x0;
      }
      else if (pnVar2->optset == (_func_nn_optset_ptr *)0x0) {
        local_8 = (nn_optset *)0x0;
      }
      else {
        pnVar3 = (*pnVar2->optset)();
        *(nn_optset **)(in_RDI + 0x170 + (long)(int)uVar1 * 8) = pnVar3;
        local_8 = *(nn_optset **)(in_RDI + 0x170 + (long)(int)uVar1 * 8);
      }
    }
    else {
      local_8 = *(nn_optset **)(in_RDI + 0x170 + (long)(int)uVar1 * 8);
    }
  }
  else {
    local_8 = (nn_optset *)0x0;
  }
  return local_8;
}

Assistant:

static struct nn_optset *nn_sock_optset (struct nn_sock *self, int id)
{
    int index;
    const struct nn_transport *tp;

    /*  Transport IDs are negative and start from -1. */
    index = (-id) - 1;

    /*  Check for invalid indices. */
    if (nn_slow (index < 0 || index >= NN_MAX_TRANSPORT))
        return NULL;

    /*  If the option set already exists return it. */
    if (nn_fast (self->optsets [index] != NULL))
        return self->optsets [index];

    /*  If the option set doesn't exist yet, create it. */
    tp = nn_global_transport (id);
    if (nn_slow (!tp))
        return NULL;
    if (nn_slow (!tp->optset))
        return NULL;
    self->optsets [index] = tp->optset ();

    return self->optsets [index];
}